

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

bool __thiscall
cmConditionEvaluator::GetBooleanValueOld
          (cmConditionEvaluator *this,cmExpandedCommandArgument *arg,bool one)

{
  cmExpandedCommandArgument *this_00;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *local_98;
  char *def_1;
  char *def;
  string local_80;
  allocator local_49;
  string local_48;
  undefined1 local_21;
  cmExpandedCommandArgument *pcStack_20;
  bool one_local;
  cmExpandedCommandArgument *arg_local;
  cmConditionEvaluator *this_local;
  
  local_21 = one;
  pcStack_20 = arg;
  arg_local = (cmExpandedCommandArgument *)this;
  if (one) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,"0",&local_49);
    bVar1 = cmExpandedCommandArgument::operator==(arg,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_00 = pcStack_20;
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_80,"1",(allocator *)((long)&def + 7));
      bVar1 = cmExpandedCommandArgument::operator==(this_00,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator((allocator<char> *)((long)&def + 7));
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        pcVar3 = GetDefinitionIfUnquoted(this,pcStack_20);
        bVar1 = cmSystemTools::IsOff(pcVar3);
        this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
      }
    }
  }
  else {
    local_98 = GetDefinitionIfUnquoted(this,arg);
    if (local_98 == (char *)0x0) {
      pcVar3 = cmExpandedCommandArgument::c_str(pcStack_20);
      iVar2 = atoi(pcVar3);
      if (iVar2 != 0) {
        local_98 = cmExpandedCommandArgument::c_str(pcStack_20);
      }
    }
    bVar1 = cmSystemTools::IsOff(local_98);
    this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool cmConditionEvaluator::GetBooleanValueOld(
  cmExpandedCommandArgument const& arg, bool one) const
{
  if(one)
    {
    // Old IsTrue behavior for single argument.
    if(arg == "0")
      { return false; }
    else if(arg == "1")
      { return true; }
    else
      {
      const char* def = this->GetDefinitionIfUnquoted(arg);
      return !cmSystemTools::IsOff(def);
      }
    }
  else
    {
    // Old GetVariableOrNumber behavior.
    const char* def = this->GetDefinitionIfUnquoted(arg);
    if(!def && atoi(arg.c_str()))
      {
      def = arg.c_str();
      }
    return !cmSystemTools::IsOff(def);
    }
}